

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void verify_swizzles(Context *ctx)

{
  MOJOSHADER_swizzle *pMVar1;
  MOJOSHADER_swizzle *swiz;
  char *failmsg;
  size_t i;
  Context *ctx_local;
  
  failmsg = (char *)0x0;
  while( true ) {
    if ((char *)(ulong)ctx->swizzles_count <= failmsg) {
      return;
    }
    pMVar1 = ctx->swizzles;
    if (3 < pMVar1[(long)failmsg].swizzles[0]) {
      fail(ctx,"invalid swizzle");
      return;
    }
    if (3 < pMVar1[(long)failmsg].swizzles[1]) {
      fail(ctx,"invalid swizzle");
      return;
    }
    if (3 < pMVar1[(long)failmsg].swizzles[2]) break;
    if (3 < pMVar1[(long)failmsg].swizzles[3]) {
      fail(ctx,"invalid swizzle");
      return;
    }
    failmsg = failmsg + 1;
  }
  fail(ctx,"invalid swizzle");
  return;
}

Assistant:

static void verify_swizzles(Context *ctx)
{
    size_t i;
    const char *failmsg = "invalid swizzle";
    for (i = 0; i < ctx->swizzles_count; i++)
    {
        const MOJOSHADER_swizzle *swiz = &ctx->swizzles[i];
        if (swiz->swizzles[0] > 3) { fail(ctx, failmsg); return; }
        if (swiz->swizzles[1] > 3) { fail(ctx, failmsg); return; }
        if (swiz->swizzles[2] > 3) { fail(ctx, failmsg); return; }
        if (swiz->swizzles[3] > 3) { fail(ctx, failmsg); return; }
    } // for
}